

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_ev_data_done(Curl_easy *data,_Bool premature)

{
  _Bool premature_local;
  Curl_easy *data_local;
  
  cf_cntrl_all(data->conn,data,true,7,premature & 1,(void *)0x0);
  return;
}

Assistant:

void Curl_conn_ev_data_done(struct Curl_easy *data, bool premature)
{
  cf_cntrl_all(data->conn, data, TRUE, CF_CTRL_DATA_DONE, premature, NULL);
}